

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncFunction.cpp
# Opt level: O3

void __thiscall
Js::JavascriptAsyncSpawnStepFunction::MarkVisitKindSpecificPtrs
          (JavascriptAsyncSpawnStepFunction *this,SnapshotExtractor *extractor)

{
  JavascriptGenerator *var;
  Var pvVar1;
  
  var = (this->generator).ptr;
  if (var != (JavascriptGenerator *)0x0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
  }
  pvVar1 = (this->reject).ptr;
  if (pvVar1 != (Var)0x0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,pvVar1);
  }
  pvVar1 = (this->resolve).ptr;
  if (pvVar1 != (Var)0x0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,pvVar1);
  }
  pvVar1 = (this->argument).ptr;
  if (pvVar1 != (Var)0x0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,pvVar1);
    return;
  }
  return;
}

Assistant:

void JavascriptAsyncSpawnStepFunction::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
{
    if (this->generator != nullptr)
    {
        extractor->MarkVisitVar(this->generator);
    }

    if (this->reject != nullptr)
    {
        extractor->MarkVisitVar(this->reject);
    }

    if (this->resolve != nullptr)
    {
        extractor->MarkVisitVar(this->resolve);
    }

    if (this->argument != nullptr)
    {
        extractor->MarkVisitVar(this->argument);
    }
}